

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset_util.c
# Opt level: O1

size_t bitset_extract_setbits_uint16(uint64_t *words,size_t length,uint16_t *out,uint16_t base)

{
  long lVar1;
  ulong uVar2;
  size_t sVar3;
  uint64_t uVar4;
  uint16_t *puVar5;
  
  uVar2 = 0;
  if (length != 0) {
    sVar3 = 0;
    do {
      uVar4 = words[sVar3];
      if (uVar4 != 0) {
        puVar5 = out + (int)uVar2;
        do {
          lVar1 = 0;
          if (uVar4 != 0) {
            for (; (uVar4 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
            }
          }
          *puVar5 = (short)lVar1 + base;
          puVar5 = puVar5 + 1;
          uVar2 = (ulong)((int)uVar2 + 1);
          uVar4 = uVar4 & uVar4 - 1;
        } while (uVar4 != 0);
      }
      base = base + 0x40;
      sVar3 = sVar3 + 1;
    } while (sVar3 != length);
    uVar2 = (ulong)(int)uVar2;
  }
  return uVar2;
}

Assistant:

size_t bitset_extract_setbits_uint16(const uint64_t *words, size_t length,
                                     uint16_t *out, uint16_t base) {
    int outpos = 0;
    for (size_t i = 0; i < length; ++i) {
        uint64_t w = words[i];
        while (w != 0) {
            uint64_t t = w & (~w + 1);
            int r = roaring_trailing_zeroes(w);
            out[outpos++] = (uint16_t)(r + base);
            w ^= t;
        }
        base += 64;
    }
    return outpos;
}